

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtr_mgr.c
# Opt level: O0

int rtr_mgr_remove_group(rtr_mgr_config *config,uint preference)

{
  long lVar1;
  void *ptr;
  rtr_mgr_group *prVar2;
  long in_FS_OFFSET;
  rtr_mgr_group *best_group;
  uint j;
  rtr_mgr_group *remove_group;
  rtr_mgr_group_node *group_node;
  tommy_node *node;
  tommy_node *remove_node;
  uint preference_local;
  rtr_mgr_config *config_local;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  pthread_rwlock_wrlock((pthread_rwlock_t *)&config->mutex);
  node = (tommy_node *)0x0;
  group_node = (rtr_mgr_group_node *)tommy_list_head(&config->groups->list);
  if (config->len == 1) {
    lrtr_dbg("RTR_MGR: Cannot remove last remaining group!");
    pthread_rwlock_unlock((pthread_rwlock_t *)&config->mutex);
    config_local._4_4_ = -1;
  }
  else {
    for (; group_node != (rtr_mgr_group_node *)0x0 && node == (tommy_node *)0x0;
        group_node = (rtr_mgr_group_node *)(group_node->node).next) {
      if (*(byte *)(*(long *)((long)(group_node->node).data + 0x20) + 0xc) == preference) {
        node = &group_node->node;
      }
    }
    if (node == (tommy_node *)0x0) {
      lrtr_dbg("RTR_MGR: The group that should be removed does not exist!");
      pthread_rwlock_unlock((pthread_rwlock_t *)&config->mutex);
      config_local._4_4_ = -1;
    }
    else {
      ptr = node->data;
      prVar2 = *(rtr_mgr_group **)((long)ptr + 0x20);
      tommy_list_remove_existing(&config->groups->list,node);
      config->len = config->len - 1;
      lrtr_dbg("RTR_MGR: Group with preference %d successfully removed!",(ulong)preference);
      pthread_rwlock_unlock((pthread_rwlock_t *)&config->mutex);
      if (prVar2->status != RTR_MGR_CLOSED) {
        for (best_group._4_4_ = 0; best_group._4_4_ < prVar2->sockets_len;
            best_group._4_4_ = best_group._4_4_ + 1) {
          rtr_stop(prVar2->sockets[best_group._4_4_]);
          tr_free(prVar2->sockets[best_group._4_4_]->tr_socket);
        }
        set_status(config,prVar2,RTR_MGR_CLOSED,(rtr_socket *)0x0);
      }
      prVar2 = rtr_mgr_get_first_group(config);
      if (prVar2->status == RTR_MGR_CLOSED) {
        rtr_mgr_start_sockets(prVar2);
      }
      lrtr_free(*(void **)((long)ptr + 0x20));
      lrtr_free(ptr);
      config_local._4_4_ = 0;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return config_local._4_4_;
  }
  __stack_chk_fail();
}

Assistant:

RTRLIB_EXPORT int rtr_mgr_remove_group(struct rtr_mgr_config *config, unsigned int preference)
{
	pthread_rwlock_wrlock(&config->mutex);
	tommy_node *remove_node = NULL;
	tommy_node *node = tommy_list_head(&config->groups->list);
	struct rtr_mgr_group_node *group_node;
	struct rtr_mgr_group *remove_group;

	if (config->len == 1) {
		MGR_DBG1("Cannot remove last remaining group!");
		pthread_rwlock_unlock(&config->mutex);
		return RTR_ERROR;
	}

	// Find the node of the group we want to remove
	while (node && !remove_node) {
		group_node = node->data;
		if (group_node->group->preference == preference)
			remove_node = node;
		node = node->next;
	}

	if (!remove_node) {
		MGR_DBG1("The group that should be removed does not exist!");
		pthread_rwlock_unlock(&config->mutex);
		return RTR_ERROR;
	}

	group_node = remove_node->data;
	remove_group = group_node->group;
	tommy_list_remove_existing(&config->groups->list, remove_node);
	config->len--;
	MGR_DBG("Group with preference %d successfully removed!", preference);
	// tommy_list_sort(&config->groups->list, &rtr_mgr_config_cmp);
	pthread_rwlock_unlock(&config->mutex);

	// If group isn't closed, make it so!
	if (remove_group->status != RTR_MGR_CLOSED) {
		for (unsigned int j = 0; j < remove_group->sockets_len; j++) {
			rtr_stop(remove_group->sockets[j]);
			tr_free(remove_group->sockets[j]->tr_socket);
		}
		set_status(config, remove_group, RTR_MGR_CLOSED, NULL);
	}

	struct rtr_mgr_group *best_group = rtr_mgr_get_first_group(config);

	if (best_group->status == RTR_MGR_CLOSED)
		rtr_mgr_start_sockets(best_group);

	lrtr_free(group_node->group);
	lrtr_free(group_node);
	return RTR_SUCCESS;
}